

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFFormFieldObjectHelper.cc
# Opt level: O2

void __thiscall
QPDFFormFieldObjectHelper::generateTextAppearance
          (QPDFFormFieldObjectHelper *this,QPDFAnnotationObjectHelper *aoh)

{
  double dVar1;
  double dVar2;
  Pl_QPDFTokenizer *pPVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  string *data;
  reference pvVar7;
  QPDFObjectHandle *pQVar8;
  element_type *peVar9;
  undefined8 uVar10;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *resources_00;
  code *pcVar11;
  size_t i;
  ulong __n;
  long lVar12;
  QPDFObjectHandle AP;
  string font_name;
  allocator<char> local_251;
  undefined1 local_250 [32];
  QPDFObjectHandle resources;
  QPDFObjectHandle AS;
  QPDFObjectHandle font;
  QPDFObjectHandle local_1f8;
  string DA;
  Pl_QPDFTokenizer tok;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  opt;
  string V;
  QPDFObjectHandle bbox_obj;
  undefined1 local_128 [16];
  QPDFObjectHandle local_118;
  QPDFObjectHandle local_108;
  Rectangle bbox;
  TfFinder tff;
  undefined1 local_50 [32];
  
  pQVar8 = &AP;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tff,"/N",(allocator<char> *)&font_name);
  std::__cxx11::string::string<std::allocator<char>>((string *)&tok,"",(allocator<char> *)&AP);
  QPDFAnnotationObjectHelper::getAppearanceStream
            ((QPDFAnnotationObjectHelper *)&AS,(string *)aoh,(string *)&tff);
  std::__cxx11::string::~string((string *)&tok);
  std::__cxx11::string::~string((string *)&tff);
  bVar4 = QPDFObjectHandle::isNull(&AS);
  if (bVar4) {
    QPDFAnnotationObjectHelper::getRect((Rectangle *)&tff,aoh);
    tok.super_Pipeline._vptr_Pipeline = (_func_int **)0x0;
    tok.super_Pipeline.identifier._M_dataplus._M_p = (pointer)0x0;
    dVar2 = (double)CONCAT44(tff._28_4_,tff.tf_idx) - (double)tff.super_TokenFilter.pipeline;
    tok.super_Pipeline.identifier.field_2._0_4_ = SUB84(dVar2,0);
    tok.super_Pipeline.identifier._M_string_length =
         tff.tf - (double)tff.super_TokenFilter._vptr_TokenFilter;
    tok.super_Pipeline.identifier.field_2._4_4_ = (int)((ulong)dVar2 >> 0x20);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&font_name,
               "<< /Resources << /ProcSet [ /PDF /Text ] >> /Type /XObject /Subtype /Form >>",
               (allocator<char> *)&DA);
    std::__cxx11::string::string<std::allocator<char>>((string *)&AP,"",(allocator<char> *)&V);
    QPDFObjectHandle::parse((QPDFObjectHandle *)&bbox,&font_name,(string *)&AP);
    std::__cxx11::string::~string((string *)&AP);
    std::__cxx11::string::~string((string *)&font_name);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&font_name,"/BBox",(allocator<char> *)&DA);
    QPDFObjectHandle::newFromRectangle((Rectangle *)&AP);
    QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&bbox,&font_name,&AP);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&AP.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&font_name);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&DA,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &(this->super_QPDFObjectHelper).super_BaseHandle);
    data = (string *)QPDFObjectHandle::getOwningQPDF((QPDFObjectHandle *)&DA);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&font_name,"/Tx BMC\nEMC\n",(allocator<char> *)&V);
    QPDFObjectHandle::newStream((QPDF *)&AP,data);
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&AS,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&AP);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&AP.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&font_name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DA._M_string_length);
    QPDFObjectHandle::replaceDict(&AS,(QPDFObjectHandle *)&bbox);
    QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)&AP);
    bVar4 = QPDFObjectHandle::isNull(&AP);
    if (bVar4) {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&DA,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &(aoh->super_QPDFObjectHelper).super_BaseHandle);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&font_name,"/AP",(allocator<char> *)local_250);
      QPDFObjectHandle::newDictionary();
      QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&DA,&font_name,(QPDFObjectHandle *)&V);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&V._M_string_length);
      std::__cxx11::string::~string((string *)&font_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&DA._M_string_length);
      QPDFAnnotationObjectHelper::getAppearanceDictionary((QPDFAnnotationObjectHelper *)&font_name);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&AP,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&font_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&font_name._M_string_length);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&font_name,"/N",(allocator<char> *)&DA);
    QPDFObjectHandle::replaceKey(&AP,&font_name,&AS);
    std::__cxx11::string::~string((string *)&font_name);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&AP.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&bbox.lly);
  }
  bVar4 = QPDFObjectHandle::isStream(&AS);
  if (bVar4) {
    QPDFObjectHandle::getDict((QPDFObjectHandle *)&tok);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tff,"/BBox",(allocator<char> *)&font_name);
    QPDFObjectHandle::getKey(&bbox_obj,(string *)&tok);
    std::__cxx11::string::~string((string *)&tff);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tok.super_Pipeline.identifier);
    bVar4 = QPDFObjectHandle::isRectangle(&bbox_obj);
    if (bVar4) {
      QPDFObjectHandle::getArrayAsRectangle(&bbox,&bbox_obj);
      getDefaultAppearance_abi_cxx11_(&DA,this);
      getValueAsString_abi_cxx11_(&V,this);
      opt.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      opt.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      opt.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      bVar4 = isChoice(this);
      if (bVar4) {
        uVar5 = getFlags(this);
        if ((uVar5 >> 0x11 & 1) == 0) {
          getChoices_abi_cxx11_
                    ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&tff,this);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_move_assign(&opt,&tff);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&tff);
        }
      }
      tff.font_name._M_dataplus._M_p = (pointer)&tff.font_name.field_2;
      tff.super_TokenFilter._vptr_TokenFilter = (_func_int **)&PTR__TfFinder_0032a1d8;
      tff.tf = 11.0;
      tff.tf_idx = -1;
      tff.font_name._M_string_length = 0;
      tff.font_name.field_2._M_local_buf[0] = '\0';
      tff.last_num = 0.0;
      tff.last_num_idx = -1;
      tff.last_name._M_dataplus._M_p = (pointer)&tff.last_name.field_2;
      tff.last_name._M_string_length = 0;
      tff.last_name.field_2._M_local_buf[0] = '\0';
      tff.DA.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      tff.DA.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      tff.DA.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar10 = 0;
      Pl_QPDFTokenizer::Pl_QPDFTokenizer(&tok,"tf",&tff.super_TokenFilter,(Pipeline *)0x0);
      Pipeline::writeString(&tok.super_Pipeline,&DA);
      Pl_QPDFTokenizer::finish(&tok);
      dVar2 = tff.tf;
      local_250._0_8_ = local_250 + 0x10;
      local_250._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_250[0x10] = '\0';
      lVar12 = (long)tff.DA.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)tff.DA.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
      for (resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr = (element_type *)0x0;
          resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr < (element_type *)(lVar12 >> 5);
          resources.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)
                   ((long)&((resources.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                           value).
                           super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                           .
                           super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                   + 1)) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&tff.DA,(size_type)
                              resources.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        std::__cxx11::string::string((string *)&font_name,(string *)pvVar7);
        iVar6 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                          ((unsigned_long *)&resources);
        if (iVar6 == tff.tf_idx) {
          dVar1 = strtod(font_name._M_dataplus._M_p,(char **)0x0);
          if (0.001 < ABS(dVar1 - tff.tf)) {
            QUtil::double_to_string_abi_cxx11_((string *)&AP,(QUtil *)0x0,tff.tf,1,SUB81(uVar10,0));
            std::__cxx11::string::operator=((string *)&font_name,(string *)&AP);
            std::__cxx11::string::~string((string *)&AP);
          }
        }
        std::__cxx11::string::append((string *)local_250);
        std::__cxx11::string::~string((string *)&font_name);
      }
      std::__cxx11::string::operator=((string *)&DA,(string *)local_250);
      std::__cxx11::string::~string((string *)local_250);
      std::__cxx11::string::string((string *)&font_name,(string *)&tff.font_name);
      if (font_name._M_string_length == 0) {
        pcVar11 = QUtil::utf8_to_ascii;
      }
      else {
        QPDFObjectHandle::getDict((QPDFObjectHandle *)local_250);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&AP,"/Resources",(allocator<char> *)&font);
        QPDFObjectHandle::getKey(&resources,(string *)local_250);
        std::__cxx11::string::~string((string *)&AP);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
        resources_00 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&resources;
        std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x10),
                   resources_00);
        getFontFromResource((QPDFFormFieldObjectHelper *)&font,(QPDFObjectHandle *)resources_00,
                            (string *)(local_50 + 0x10));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 0x18));
        if (font.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr == (element_type *)0x0) {
          getDefaultResources((QPDFFormFieldObjectHelper *)&AP);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_50,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&AP);
          getFontFromResource((QPDFFormFieldObjectHelper *)local_250,pQVar8,(string *)local_50);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&font,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_250);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_50 + 8));
          bVar4 = QPDFObjectHandle::isDictionary(&font);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&AP.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          if (bVar4) {
            bVar4 = QPDFObjectHandle::isDictionary(&resources);
            if (bVar4) {
              bVar4 = QPDFObjectHandle::isIndirect(&resources);
              if (bVar4) {
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&AP,"",(allocator<char> *)&local_1f8);
                pQVar8 = (QPDFObjectHandle *)QPDFObjectHandle::getQPDF(&resources,(string *)&AP);
                QPDFObjectHandle::shallowCopy(&local_108);
                QPDF::makeIndirectObject((QPDF *)local_250,pQVar8);
                std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                          ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&resources,
                           (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)local_250);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          (&local_108.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
                std::__cxx11::string::~string((string *)&AP);
                QPDFObjectHandle::getDict((QPDFObjectHandle *)local_250);
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&AP,"/Resources",(allocator<char> *)&local_1f8);
                QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_250,(string *)&AP,&resources)
                ;
                std::__cxx11::string::~string((string *)&AP);
                std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
              }
              operator____qpdf((char *)&local_118,0x28e5bd);
              QPDFObjectHandle::mergeResources
                        (&resources,&local_118,
                         (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                          *)0x0);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        (&local_118.super_BaseHandle.obj.
                          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&AP,"/Font",(allocator<char> *)&local_1f8);
              QPDFObjectHandle::getKey((QPDFObjectHandle *)local_250,(string *)&resources);
              QPDFObjectHandle::replaceKey((QPDFObjectHandle *)local_250,&font_name,&font);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
              std::__cxx11::string::~string((string *)&AP);
            }
          }
        }
        bVar4 = QPDFObjectHandle::isDictionary(&font);
        pcVar11 = QUtil::utf8_to_ascii;
        if (bVar4) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&AP,"/Encoding",(allocator<char> *)&local_1f8);
          QPDFObjectHandle::getKey((QPDFObjectHandle *)local_250,(string *)&font);
          bVar4 = QPDFObjectHandle::isName((QPDFObjectHandle *)local_250);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_250 + 8));
          std::__cxx11::string::~string((string *)&AP);
          if (bVar4) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_250,"/Encoding",&local_251);
            QPDFObjectHandle::getKey(&local_1f8,(string *)&font);
            QPDFObjectHandle::getName_abi_cxx11_((string *)&AP,&local_1f8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&local_1f8.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            std::__cxx11::string::~string((string *)local_250);
            bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&AP,"/WinAnsiEncoding");
            if (bVar4) {
              pcVar11 = QUtil::utf8_to_win_ansi;
            }
            else {
              bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&AP,"/MacRomanEncoding");
              if (bVar4) {
                pcVar11 = QUtil::utf8_to_mac_roman;
              }
              else {
                pcVar11 = QUtil::utf8_to_ascii;
              }
            }
            std::__cxx11::string::~string((string *)&AP);
          }
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&font.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&resources.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      }
      (*pcVar11)(&AP,&V,0x3f);
      std::__cxx11::string::operator=((string *)&V,(string *)&AP);
      std::__cxx11::string::~string((string *)&AP);
      for (__n = 0; __n < (ulong)((long)opt.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)opt.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 5);
          __n = __n + 1) {
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&opt,__n);
        (*pcVar11)(&AP,pvVar7,0x3f);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&opt,__n);
        std::__cxx11::string::operator=((string *)pvVar7,(string *)&AP);
        std::__cxx11::string::~string((string *)&AP);
      }
      peVar9 = (element_type *)operator_new(0x98);
      peVar9->_vptr_TokenFilter = (_func_int **)&PTR__ValueSetter_0032a220;
      std::__cxx11::string::string((string *)(peVar9 + 1),(string *)&DA);
      std::__cxx11::string::string((string *)(peVar9 + 3),(string *)&V);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(peVar9 + 5),&opt);
      peVar9[6].pipeline = (Pipeline *)dVar2;
      peVar9[7]._vptr_TokenFilter = (_func_int **)bbox.llx;
      peVar9[7].pipeline = (Pipeline *)bbox.lly;
      peVar9[8]._vptr_TokenFilter = (_func_int **)bbox.urx;
      peVar9[8].pipeline = (Pipeline *)bbox.ury;
      *(undefined4 *)&peVar9[9]._vptr_TokenFilter = 0;
      *(undefined1 *)((long)&peVar9[9]._vptr_TokenFilter + 4) = 0;
      local_128._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_128._0_8_ = peVar9;
      local_128._8_8_ = operator_new(0x18);
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_M_use_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_M_weak_count = 1;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._8_8_)->_vptr__Sp_counted_base =
           (_func_int **)&PTR___Sp_counted_base_0032a268;
      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_128._8_8_ + 0x10))->
      _vptr__Sp_counted_base = (_func_int **)peVar9;
      QPDFObjectHandle::addTokenFilter(&AS,(shared_ptr<QPDFObjectHandle::TokenFilter> *)local_128);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128 + 8));
      std::__cxx11::string::~string((string *)&font_name);
      Pl_QPDFTokenizer::~Pl_QPDFTokenizer(&tok);
      anon_unknown.dwarf_23c521::TfFinder::~TfFinder(&tff);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&opt);
      std::__cxx11::string::~string((string *)&V);
      std::__cxx11::string::~string((string *)&DA);
    }
    else {
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&tok,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &(aoh->super_QPDFObjectHelper).super_BaseHandle);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&tff,"unable to get appearance stream bounding box",
                 (allocator<char> *)&font_name);
      QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&tok,(string *)&tff);
      std::__cxx11::string::~string((string *)&tff);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&tok.super_Pipeline.identifier);
    }
    pPVar3 = (Pl_QPDFTokenizer *)&bbox_obj;
  }
  else {
    std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&tok,
               (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
               &(aoh->super_QPDFObjectHelper).super_BaseHandle);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&tff,"unable to get normal appearance stream for update",
               (allocator<char> *)&font_name);
    QPDFObjectHandle::warnIfPossible((QPDFObjectHandle *)&tok,(string *)&tff);
    std::__cxx11::string::~string((string *)&tff);
    pPVar3 = &tok;
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(pPVar3->super_Pipeline).identifier);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&AS.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

void
QPDFFormFieldObjectHelper::generateTextAppearance(QPDFAnnotationObjectHelper& aoh)
{
    QPDFObjectHandle AS = aoh.getAppearanceStream("/N");
    if (AS.isNull()) {
        QTC::TC("qpdf", "QPDFFormFieldObjectHelper create AS from scratch");
        QPDFObjectHandle::Rectangle rect = aoh.getRect();
        QPDFObjectHandle::Rectangle bbox(0, 0, rect.urx - rect.llx, rect.ury - rect.lly);
        QPDFObjectHandle dict = QPDFObjectHandle::parse(
            "<< /Resources << /ProcSet [ /PDF /Text ] >> /Type /XObject /Subtype /Form >>");
        dict.replaceKey("/BBox", QPDFObjectHandle::newFromRectangle(bbox));
        AS = QPDFObjectHandle::newStream(oh().getOwningQPDF(), "/Tx BMC\nEMC\n");
        AS.replaceDict(dict);
        QPDFObjectHandle AP = aoh.getAppearanceDictionary();
        if (AP.isNull()) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper create AP from scratch");
            aoh.getObjectHandle().replaceKey("/AP", QPDFObjectHandle::newDictionary());
            AP = aoh.getAppearanceDictionary();
        }
        AP.replaceKey("/N", AS);
    }
    if (!AS.isStream()) {
        aoh.getObjectHandle().warnIfPossible("unable to get normal appearance stream for update");
        return;
    }
    QPDFObjectHandle bbox_obj = AS.getDict().getKey("/BBox");
    if (!bbox_obj.isRectangle()) {
        aoh.getObjectHandle().warnIfPossible("unable to get appearance stream bounding box");
        return;
    }
    QPDFObjectHandle::Rectangle bbox = bbox_obj.getArrayAsRectangle();
    std::string DA = getDefaultAppearance();
    std::string V = getValueAsString();
    std::vector<std::string> opt;
    if (isChoice() && ((getFlags() & ff_ch_combo) == 0)) {
        opt = getChoices();
    }

    TfFinder tff;
    Pl_QPDFTokenizer tok("tf", &tff);
    tok.writeString(DA);
    tok.finish();
    double tf = tff.getTf();
    DA = tff.getDA();

    std::string (*encoder)(std::string const&, char) = &QUtil::utf8_to_ascii;
    std::string font_name = tff.getFontName();
    if (!font_name.empty()) {
        // See if the font is encoded with something we know about.
        QPDFObjectHandle resources = AS.getDict().getKey("/Resources");
        QPDFObjectHandle font = getFontFromResource(resources, font_name);
        bool found_font_in_dr = false;
        if (!font) {
            QPDFObjectHandle dr = getDefaultResources();
            font = getFontFromResource(dr, font_name);
            found_font_in_dr = font.isDictionary();
        }
        if (found_font_in_dr && resources.isDictionary()) {
            QTC::TC("qpdf", "QPDFFormFieldObjectHelper get font from /DR");
            if (resources.isIndirect()) {
                resources = resources.getQPDF().makeIndirectObject(resources.shallowCopy());
                AS.getDict().replaceKey("/Resources", resources);
            }
            // Use mergeResources to force /Font to be local
            resources.mergeResources("<< /Font << >> >>"_qpdf);
            resources.getKey("/Font").replaceKey(font_name, font);
        }

        if (font.isDictionary() && font.getKey("/Encoding").isName()) {
            std::string encoding = font.getKey("/Encoding").getName();
            if (encoding == "/WinAnsiEncoding") {
                QTC::TC("qpdf", "QPDFFormFieldObjectHelper WinAnsi");
                encoder = &QUtil::utf8_to_win_ansi;
            } else if (encoding == "/MacRomanEncoding") {
                encoder = &QUtil::utf8_to_mac_roman;
            }
        }
    }

    V = (*encoder)(V, '?');
    for (size_t i = 0; i < opt.size(); ++i) {
        opt.at(i) = (*encoder)(opt.at(i), '?');
    }

    AS.addTokenFilter(
        std::shared_ptr<QPDFObjectHandle::TokenFilter>(new ValueSetter(DA, V, opt, tf, bbox)));
}